

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O0

void __thiscall ValidateVulnerability::CheckVulnerabilityID(ValidateVulnerability *this)

{
  int iVar1;
  ValidateVulnerability *this_local;
  
  iVar1 = Validate::CheckIDDoesNotExceedMaxLimit
                    (&this->super_Validate,this->vulIDName_,this->initialVulID_);
  (this->v_).vulnerability_id = iVar1;
  if ((this->v_).vulnerability_id < this->prevVulID_) {
    fprintf(_stderr,
            "ERROR: Vulnerability IDs %d and %d in lines %d and %d respectively are not in ascending order:\n%s\n%s\n"
            ,(ulong)(uint)this->prevVulID_,(ulong)(uint)(this->v_).vulnerability_id,
            (ulong)((this->super_Validate).lineno_ - 1),(ulong)(uint)(this->super_Validate).lineno_,
            &this->super_Validate,this->prevLine_);
    Validate::PrintErrorMessage(&this->super_Validate);
  }
  return;
}

Assistant:

inline void ValidateVulnerability::CheckVulnerabilityID() {
/* Check vulnerability ID does not exceed maximum integer value and
 * vulnerability IDs are in ascending order. */

  v_.vulnerability_id = CheckIDDoesNotExceedMaxLimit(vulIDName_,
						     initialVulID_);

  if (prevVulID_ <= v_.vulnerability_id) return;

  fprintf(stderr, "ERROR: Vulnerability IDs %d and %d in lines %d and %d"
		  " respectively are not in ascending order:\n%s\n%s\n",
	  prevVulID_, v_.vulnerability_id, lineno_ - 1, lineno_, line_,
	  prevLine_);
  PrintErrorMessage();

}